

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O0

void __thiscall
SimpleBVH::BVH::init_boxes_recursive
          (BVH *this,
          vector<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
          *cornerlist,int node_index,int b,int e)

{
  double dVar1;
  int e_00;
  int node_index_00;
  int node_index_01;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *this_00;
  Index IVar5;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_1> *pDVar6;
  Scalar *pSVar7;
  Scalar *pSVar8;
  double *pdVar9;
  int local_34;
  int c;
  int childr;
  int childl;
  int m;
  int e_local;
  int b_local;
  int node_index_local;
  vector<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
  *cornerlist_local;
  BVH *this_local;
  
  if (b == e) {
    __assert_fail("b != e",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                  ,0xb9,
                  "void SimpleBVH::BVH::init_boxes_recursive(const std::vector<std::array<VectorMax3d, 2>> &, int, int, int)"
                 );
  }
  sVar2 = std::
          vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
          ::size(&this->boxlist);
  if (sVar2 <= (ulong)(long)node_index) {
    __assert_fail("node_index < boxlist.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                  ,0xba,
                  "void SimpleBVH::BVH::init_boxes_recursive(const std::vector<std::array<VectorMax3d, 2>> &, int, int, int)"
                 );
  }
  if (b + 1 == e) {
    pvVar3 = std::
             vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
             ::operator[](cornerlist,(long)b);
    pvVar4 = std::
             vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
             ::operator[](&this->boxlist,(long)node_index);
    std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator=(pvVar4,pvVar3);
  }
  else {
    e_00 = b + (e - b) / 2;
    node_index_00 = node_index << 1;
    node_index_01 = node_index * 2 + 1;
    sVar2 = std::
            vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
            ::size(&this->boxlist);
    if (sVar2 <= (ulong)(long)node_index_00) {
      __assert_fail("childl < boxlist.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                    ,0xc4,
                    "void SimpleBVH::BVH::init_boxes_recursive(const std::vector<std::array<VectorMax3d, 2>> &, int, int, int)"
                   );
    }
    sVar2 = std::
            vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
            ::size(&this->boxlist);
    if (sVar2 <= (ulong)(long)node_index_01) {
      __assert_fail("childr < boxlist.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                    ,0xc5,
                    "void SimpleBVH::BVH::init_boxes_recursive(const std::vector<std::array<VectorMax3d, 2>> &, int, int, int)"
                   );
    }
    init_boxes_recursive(this,cornerlist,node_index_00,b,e_00);
    init_boxes_recursive(this,cornerlist,node_index_01,e_00,e);
    sVar2 = std::
            vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
            ::size(&this->boxlist);
    if (sVar2 <= (ulong)(long)node_index_00) {
      __assert_fail("childl < boxlist.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                    ,0xca,
                    "void SimpleBVH::BVH::init_boxes_recursive(const std::vector<std::array<VectorMax3d, 2>> &, int, int, int)"
                   );
    }
    sVar2 = std::
            vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
            ::size(&this->boxlist);
    if (sVar2 <= (ulong)(long)node_index_01) {
      __assert_fail("childr < boxlist.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                    ,0xcb,
                    "void SimpleBVH::BVH::init_boxes_recursive(const std::vector<std::array<VectorMax3d, 2>> &, int, int, int)"
                   );
    }
    local_34 = 0;
    while( true ) {
      pvVar3 = std::
               vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
               ::operator[](cornerlist,0);
      this_00 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)
                std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[](pvVar3,0);
      IVar5 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>::size(this_00);
      if (IVar5 <= local_34) break;
      pvVar4 = std::
               vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
               ::operator[](&this->boxlist,(long)node_index_00);
      pDVar6 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_1> *)
               std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[](pvVar4,0);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_1>::operator[]
                         (pDVar6,(long)local_34);
      pvVar4 = std::
               vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
               ::operator[](&this->boxlist,(long)node_index_01);
      pDVar6 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_1> *)
               std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[](pvVar4,0);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_1>::operator[]
                         (pDVar6,(long)local_34);
      pdVar9 = std::min<double>(pSVar7,pSVar8);
      dVar1 = *pdVar9;
      pvVar4 = std::
               vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
               ::operator[](&this->boxlist,(long)node_index);
      pDVar6 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_1> *)
               std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[](pvVar4,0);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_1>::operator[]
                         (pDVar6,(long)local_34);
      *pSVar7 = dVar1;
      pvVar4 = std::
               vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
               ::operator[](&this->boxlist,(long)node_index_00);
      pDVar6 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_1> *)
               std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[](pvVar4,1);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_1>::operator[]
                         (pDVar6,(long)local_34);
      pvVar4 = std::
               vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
               ::operator[](&this->boxlist,(long)node_index_01);
      pDVar6 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_1> *)
               std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[](pvVar4,1);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_1>::operator[]
                         (pDVar6,(long)local_34);
      pdVar9 = std::max<double>(pSVar7,pSVar8);
      dVar1 = *pdVar9;
      pvVar4 = std::
               vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
               ::operator[](&this->boxlist,(long)node_index);
      pDVar6 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_1> *)
               std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[](pvVar4,1);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_1>::operator[]
                         (pDVar6,(long)local_34);
      *pSVar7 = dVar1;
      local_34 = local_34 + 1;
    }
  }
  return;
}

Assistant:

void BVH::init_boxes_recursive(
    const std::vector<std::array<VectorMax3d, 2>>& cornerlist,
    int node_index,
    int b,
    int e)
{
    assert(b != e);
    assert(node_index < boxlist.size());

    if (b + 1 == e) {
        boxlist[node_index] = cornerlist[b];
        return;
    }
    int m = b + (e - b) / 2;
    int childl = 2 * node_index;
    int childr = 2 * node_index + 1;

    assert(childl < boxlist.size());
    assert(childr < boxlist.size());

    init_boxes_recursive(cornerlist, childl, b, m);
    init_boxes_recursive(cornerlist, childr, m, e);

    assert(childl < boxlist.size());
    assert(childr < boxlist.size());
    for (int c = 0; c < cornerlist[0][0].size(); ++c) {
        boxlist[node_index][0][c] =
            std::min(boxlist[childl][0][c], boxlist[childr][0][c]);
        boxlist[node_index][1][c] =
            std::max(boxlist[childl][1][c], boxlist[childr][1][c]);
    }
}